

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

any __thiscall
cs_impl::any::make<std::__cxx11::string,std::__cxx11::string>
          (any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  baseHolder *pbVar3;
  proxy *ppVar4;
  
  if ((DAT_0025d2c0 == 0) || (cs::global_thread_counter != 0)) {
    pbVar3 = (baseHolder *)operator_new(0x28);
  }
  else {
    pbVar3 = *(baseHolder **)(&holder<cs::pointer>::allocator + DAT_0025d2c0 * 8);
    DAT_0025d2c0 = DAT_0025d2c0 + -1;
  }
  pbVar3->_vptr_baseHolder = (_func_int **)&PTR__holder_00253c98;
  pbVar3[1]._vptr_baseHolder = (_func_int **)(pbVar3 + 3);
  pp_Var2 = (_func_int **)(args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pp_Var2 == paVar1) {
    pp_Var2 = *(_func_int ***)((long)&args->field_2 + 8);
    pbVar3[3]._vptr_baseHolder = (_func_int **)paVar1->_M_allocated_capacity;
    pbVar3[4]._vptr_baseHolder = pp_Var2;
  }
  else {
    pbVar3[1]._vptr_baseHolder = pp_Var2;
    pbVar3[3]._vptr_baseHolder = (_func_int **)paVar1->_M_allocated_capacity;
  }
  pbVar3[2]._vptr_baseHolder = (_func_int **)args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  if ((DAT_0025fe20 == 0) || (cs::global_thread_counter != 0)) {
    ppVar4 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar4 = (proxy *)(&cs::null_pointer)[DAT_0025fe20];
    DAT_0025fe20 = DAT_0025fe20 + -1;
  }
  ppVar4->is_rvalue = false;
  ppVar4->protect_level = 0;
  ppVar4->refcount = 1;
  ppVar4->data = pbVar3;
  this->mDat = ppVar4;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}